

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O3

NormalizeOption __thiscall
cmArgumentParser<(anonymous_namespace)::NormalizeOption>::
Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (cmArgumentParser<(anonymous_namespace)::NormalizeOption> *this,
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unparsedArguments,size_t pos)

{
  NormalizeOption result;
  undefined1 local_71;
  Instance local_70;
  
  local_70.Result = &local_71;
  local_71 = 0;
  local_70.ParseResults = (ParseResult *)0x0;
  local_70.Keyword._M_len = 0;
  local_70.Keyword._M_str = (char *)0x0;
  local_70.KeywordValuesSeen = 0;
  local_70.KeywordValuesExpected = 0;
  local_70.KeywordValueFunc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_70.KeywordValueFunc.super__Function_base._M_functor._8_8_ = 0;
  local_70.KeywordValueFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  local_70.KeywordValueFunc._M_invoker = (_Invoker_type)0x0;
  local_70.DoneWithPositional = false;
  local_70.Bindings = (ActionMap *)this;
  local_70.UnparsedArguments = unparsedArguments;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_70,args,0);
  if (local_70.KeywordValueFunc.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.KeywordValueFunc.super__Function_base._M_manager)
              ((_Any_data *)&local_70.KeywordValueFunc,(_Any_data *)&local_70.KeywordValueFunc,
               __destroy_functor);
  }
  return (NormalizeOption)(bool)local_71;
}

Assistant:

Result Parse(Range const& args, std::vector<std::string>* unparsedArguments,
               std::size_t pos = 0) const
  {
    Result result;
    this->Parse(result, args, unparsedArguments, pos);
    return result;
  }